

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *vec)

{
  uint *puVar1;
  int iVar2;
  cpp_dec_float<50U,_int,_void> *pcVar3;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar4;
  int *piVar5;
  uint uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<50U,_int,_void> local_c8;
  int *local_90;
  pointer local_88;
  int *local_80;
  int *local_78;
  long local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_70 = (long)this->thedim;
  if (local_70 != 0) {
    local_88 = (this->l).rval.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_90 = (this->l).ridx;
    local_80 = (this->l).rbeg;
    local_78 = (this->l).rorig;
    do {
      lVar4 = (long)local_78[local_70 + -1];
      local_68.data._M_elems._32_8_ = *(undefined8 *)(vec[lVar4].m_backend.data._M_elems + 8);
      local_68.data._M_elems._0_8_ = *(undefined8 *)vec[lVar4].m_backend.data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)(vec[lVar4].m_backend.data._M_elems + 2);
      puVar1 = vec[lVar4].m_backend.data._M_elems + 4;
      local_68.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_68.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_68.exp = vec[lVar4].m_backend.exp;
      local_68.neg = vec[lVar4].m_backend.neg;
      local_68.fpclass = vec[lVar4].m_backend.fpclass;
      local_68.prec_elem = vec[lVar4].m_backend.prec_elem;
      if (local_68.fpclass == cpp_dec_float_NaN) {
LAB_002b5b12:
        iVar2 = local_80[lVar4];
        if (iVar2 < local_80[lVar4 + 1]) {
          piVar5 = local_90 + iVar2;
          pcVar3 = &local_88[iVar2].m_backend;
          uVar6 = (local_80[lVar4 + 1] - iVar2) + 1;
          do {
            local_c8.fpclass = cpp_dec_float_finite;
            local_c8.prec_elem = 10;
            local_c8.data._M_elems[0] = 0;
            local_c8.data._M_elems[1] = 0;
            local_c8.data._M_elems[2] = 0;
            local_c8.data._M_elems[3] = 0;
            local_c8.data._M_elems[4] = 0;
            local_c8.data._M_elems[5] = 0;
            local_c8.data._M_elems._24_5_ = 0;
            local_c8.data._M_elems[7]._1_3_ = 0;
            local_c8.data._M_elems._32_5_ = 0;
            local_c8.data._M_elems[9]._1_3_ = 0;
            local_c8.exp = 0;
            local_c8.neg = false;
            v = &local_68;
            if (pcVar3 != &local_c8) {
              local_c8.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
              local_c8.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
              local_c8.data._M_elems[4] = local_68.data._M_elems[4];
              local_c8.data._M_elems[5] = local_68.data._M_elems[5];
              local_c8.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
              local_c8.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
              local_c8.data._M_elems[0] = local_68.data._M_elems[0];
              local_c8.data._M_elems[1] = local_68.data._M_elems[1];
              local_c8.data._M_elems[2] = local_68.data._M_elems[2];
              local_c8.data._M_elems[3] = local_68.data._M_elems[3];
              local_c8.exp = local_68.exp;
              local_c8.neg = local_68.neg;
              local_c8.fpclass = local_68.fpclass;
              local_c8.prec_elem = local_68.prec_elem;
              v = pcVar3;
            }
            pcVar3 = pcVar3 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_c8,v);
            iVar2 = *piVar5;
            piVar5 = piVar5 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&vec[iVar2].m_backend,&local_c8);
            uVar6 = uVar6 - 1;
          } while (1 < uVar6);
        }
      }
      else {
        local_c8.fpclass = cpp_dec_float_finite;
        local_c8.prec_elem = 10;
        local_c8.data._M_elems[0] = 0;
        local_c8.data._M_elems[1] = 0;
        local_c8.data._M_elems[2] = 0;
        local_c8.data._M_elems[3] = 0;
        local_c8.data._M_elems[4] = 0;
        local_c8.data._M_elems[5] = 0;
        local_c8.data._M_elems._24_5_ = 0;
        local_c8.data._M_elems[7]._1_3_ = 0;
        local_c8.data._M_elems._32_5_ = 0;
        local_c8.data._M_elems[9]._1_3_ = 0;
        local_c8.exp = 0;
        local_c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_c8,0.0);
        iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_68,&local_c8);
        if (iVar2 != 0) goto LAB_002b5b12;
      }
      local_70 = local_70 + -1;
    } while (local_70 != 0);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftNoNZ(R* vec)
{
   int i, j, k;
   int r;
   R x;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig;

   ridx = l.ridx;
   rval = l.rval.data();
   rbeg = l.rbeg;
   rorig = l.rorig;

#ifndef SOPLEX_WITH_L_ROWS
   R* lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   i = l.firstUpdate - 1;
   assert(i < thedim);

   for(; i >= 0; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         x += vec[*idx++] * (*val++);
      }

      vec[lrow[i]] -= x;
   }

#else

   for(i = thedim; i--;)
   {
      r = rorig[i];
      x = vec[r];

      if(x != 0.0)
      {
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            vec[*idx++] -= x * *val++;
         }
      }
   }

#endif
}